

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdMicroAllocator.cpp
# Opt level: O3

void __thiscall HACD::MyMicroAllocator::removeMicroChunk(MyMicroAllocator *this,MemoryChunk *chunk)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  
  this->mLastMicroChunk = (MicroChunk *)0x0;
  uVar3 = this->mMicroChunkCount;
  if ((ulong)uVar3 != 0) {
    lVar7 = 0x20;
    uVar8 = 0;
    do {
      if (*(MemoryChunk **)((long)this->mMicroChunks + lVar7 + -0x10) == chunk) {
        this->mMicroChunkCount = uVar3 - 1;
        if (uVar3 - 1 <= (uint)uVar8) {
          return;
        }
        do {
          uVar8 = uVar8 + 1;
          puVar1 = (undefined8 *)((long)&this->mMicroChunks->mMemStart + lVar7);
          uVar4 = puVar1[1];
          uVar5 = puVar1[2];
          uVar6 = puVar1[3];
          puVar2 = (undefined8 *)((long)&this->mMicroChunks[-1].mMemStart + lVar7);
          *puVar2 = *puVar1;
          puVar2[1] = uVar4;
          puVar2[2] = uVar5;
          puVar2[3] = uVar6;
          lVar7 = lVar7 + 0x20;
        } while (uVar8 < this->mMicroChunkCount);
        return;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x20;
    } while (uVar3 != uVar8);
  }
  return;
}

Assistant:

virtual void removeMicroChunk(MemoryChunk *chunk)
  {
    mLastMicroChunk = 0;
    #ifdef _DEBUG
    bool removed = false;
    #endif
    for (NxU32 i=0; i<mMicroChunkCount; i++)
    {
        if ( mMicroChunks[i].mChunk == chunk )
        {
            mMicroChunkCount--;
            for (NxU32 j=i; j<mMicroChunkCount; j++)
            {
                mMicroChunks[j] = mMicroChunks[j+1];
            }
            #ifdef _DEBUG
            removed = true;
            #endif
            break;
        }
    }
#ifdef _DEBUG
    assert(removed);
#endif
  }